

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall xray_re::way_link_io::operator()(way_link_io *this,way_link *link,xr_reader *r)

{
  uint16_t *puVar1;
  float *pfVar2;
  
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  link->from = *puVar1;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  link->to = *puVar1;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  link->weight = *pfVar2;
  return;
}

Assistant:

inline uint16_t xr_reader::r_u16() { return *m_p_u16++; }